

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTaskIIF::execute(LineBufferTaskIIF *this)

{
  LineBuffer *pLVar1;
  Data *pDVar2;
  unsigned_long uVar3;
  pointer psVar4;
  int x;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  LogicExc *this_00;
  ulong uVar8;
  long lVar9;
  int iVar10;
  size_t i;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  unsigned_short local_a2;
  size_t pixelsToCopyNormal;
  size_t pixelsToCopySSE;
  unsigned_short *writePtrRight;
  unsigned_short *writePtrLeft;
  int local_7c;
  unsigned_short *readPointers [8];
  
  pLVar1 = this->_lineBuffer;
  if ((pLVar1->buffer)._size == 0) {
    pDVar2 = this->_ifd;
    iVar5 = pLVar1->dataSize;
    if (pDVar2->maxY < pLVar1->dataSize) {
      iVar5 = pDVar2->maxY;
    }
    uVar8 = 0;
    for (lVar11 = (long)(*(int *)((long)&pLVar1->dataPtr + 4) - pDVar2->minY);
        lVar11 <= iVar5 - pDVar2->minY; lVar11 = lVar11 + 1) {
      uVar8 = uVar8 + (pDVar2->bytesPerLine).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
    }
    if (((long *)pLVar1->endOfLineBufferData == (long *)0x0) ||
       (uVar8 <= (ulong)(long)*(int *)&pLVar1->dataPtr)) {
      pLVar1->minY = 1;
      (pLVar1->buffer)._size = (long)(pLVar1->buffer)._data;
    }
    else {
      iVar5 = (**(code **)(*(long *)pLVar1->endOfLineBufferData + 0x18))();
      pLVar1 = this->_lineBuffer;
      pLVar1->minY = iVar5;
      uVar6 = (**(code **)(*(long *)pLVar1->endOfLineBufferData + 0x30))
                        (pLVar1->endOfLineBufferData,(pLVar1->buffer)._data,
                         *(undefined4 *)&pLVar1->dataPtr,*(undefined4 *)((long)&pLVar1->dataPtr + 4)
                        );
      *(undefined4 *)&this->_lineBuffer->dataPtr = uVar6;
    }
  }
  bVar14 = this->_ifd->lineOrder == INCREASING_Y;
  iVar5 = this->_scanLineMin + -1;
  if (bVar14) {
    iVar5 = this->_scanLineMax + 1;
  }
  iVar10 = (bVar14 - 1) + (uint)bVar14;
  x = this->_scanLineMin;
  local_7c = iVar10;
  if (!bVar14) {
    x = this->_scanLineMax;
  }
  do {
    if (x == iVar5) {
      return;
    }
    iVar7 = Imath_2_5::modp(x,(this->_optimizationMode)._ySampling);
    if (iVar7 == 0) {
      pDVar2 = this->_ifd;
      lVar11 = (this->_lineBuffer->buffer)._size;
      uVar3 = (pDVar2->offsetInLineBuffer).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)x - (long)pDVar2->minY];
      pixelsToCopySSE = 0;
      pixelsToCopyNormal = 0;
      writePtrLeft = (unsigned_short *)0x0;
      writePtrRight = (unsigned_short *)0x0;
      lVar13 = (long)(pDVar2->optimizationData).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pDVar2->optimizationData).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = lVar13 / 0x38;
      if (uVar8 < 5) {
        getWritePointer<half>(this,x,&writePtrRight,&pixelsToCopySSE,&pixelsToCopyNormal,0);
      }
      else {
        getWritePointer<half>(this,x,&writePtrRight,&pixelsToCopySSE,&pixelsToCopyNormal,0);
        if (writePtrRight != (unsigned_short *)0x0) {
          getWritePointer<half>(this,x,&writePtrLeft,&pixelsToCopySSE,&pixelsToCopyNormal,1);
        }
      }
      iVar10 = local_7c;
      if ((writePtrRight != (unsigned_short *)0x0 || pixelsToCopySSE != 0) ||
          pixelsToCopyNormal != 0) {
        pDVar2 = this->_ifd;
        lVar9 = 2;
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          readPointers[uVar12] =
               (unsigned_short *)
               (lVar11 + uVar3 +
               (long)(&((pDVar2->optimizationData).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->base)[lVar9] *
               (pixelsToCopyNormal + pixelsToCopySSE * 8) * 2);
          lVar9 = lVar9 + 7;
        }
        if ((uVar8 == 3) || (uVar8 == 6)) {
          optimizedWriteToRGB(readPointers,readPointers + 1,readPointers + 2,&writePtrRight,
                              &pixelsToCopySSE,&pixelsToCopyNormal);
          iVar10 = local_7c;
          if (lVar13 == 0x150) {
            optimizedWriteToRGB(readPointers + 3,readPointers + 4,readPointers + 5,&writePtrLeft,
                                &pixelsToCopySSE,&pixelsToCopyNormal);
            iVar10 = local_7c;
          }
        }
        else {
          if ((uVar8 != 8) && (uVar8 != 4)) {
            this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::LogicExc::LogicExc(this_00,"IIF mode called with incorrect channel pattern");
            __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
          }
          psVar4 = (pDVar2->optimizationData).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (psVar4[3].fill == true) {
            local_a2 = psVar4[3].fillValue._h;
            optimizedWriteToRGBAFillA
                      (readPointers,readPointers + 1,readPointers + 2,&local_a2,&writePtrRight,
                       &pixelsToCopySSE,&pixelsToCopyNormal);
          }
          else {
            optimizedWriteToRGBA
                      (readPointers,readPointers + 1,readPointers + 2,readPointers + 3,
                       &writePtrRight,&pixelsToCopySSE,&pixelsToCopyNormal);
          }
          iVar10 = local_7c;
          if (lVar13 == 0x1c0) {
            psVar4 = (this->_ifd->optimizationData).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (psVar4[7].fill == true) {
              local_a2 = psVar4[7].fillValue._h;
              optimizedWriteToRGBAFillA
                        (readPointers + 4,readPointers + 5,readPointers + 6,&local_a2,&writePtrLeft,
                         &pixelsToCopySSE,&pixelsToCopyNormal);
              iVar10 = local_7c;
            }
            else {
              optimizedWriteToRGBA
                        (readPointers + 4,readPointers + 5,readPointers + 6,readPointers + 7,
                         &writePtrLeft,&pixelsToCopySSE,&pixelsToCopyNormal);
              iVar10 = local_7c;
            }
          }
        }
      }
    }
    x = x + iVar10;
  } while( true );
}

Assistant:

void
LineBufferTaskIIF::execute()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //
        
        if (_lineBuffer->uncompressedData == 0)
        {
            size_t uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);
            
            for (int i = _lineBuffer->minY - _ifd->minY;
            i <= maxY - _ifd->minY;
            ++i)
            {
                uncompressedSize += _ifd->bytesPerLine[i];
            }
            
            if (_lineBuffer->compressor &&
                static_cast<size_t>(_lineBuffer->dataSize) < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();
                
                _lineBuffer->dataSize =
                _lineBuffer->compressor->uncompress (_lineBuffer->buffer,
                                                     _lineBuffer->dataSize,
                                                     _lineBuffer->minY,
                                                     _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //
                
                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }
        
        int yStart, yStop, dy;
        
        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }
        
        for (int y = yStart; y != yStop; y += dy)
        {
            if (modp (y, _optimizationMode._ySampling) != 0)
                continue;
            
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //
            
            // Set the readPtr to read at the start of uncompressedData
            // but with an offet based on calculated array.
            // _ifd->offsetInLineBuffer contains offsets based on which
            // line we are currently processing.
            // Stride will be taken into consideration later.
                
                
            const char* readPtr = _lineBuffer->uncompressedData +
            _ifd->offsetInLineBuffer[y - _ifd->minY];
            
            size_t pixelsToCopySSE = 0;
            size_t pixelsToCopyNormal = 0;
            
            unsigned short* writePtrLeft = 0;
            unsigned short* writePtrRight = 0;
            
            size_t channels = _ifd->optimizationData.size();
       
            if(channels>4)
            {
                getWritePointerStereo<half>(y, writePtrRight, writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
            }
            else 
            {
                getWritePointer<half>(y, writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
            }
            
            if (writePtrRight == 0 && pixelsToCopySSE == 0 && pixelsToCopyNormal == 0)
            {
                continue;
            }
            
            
            //
            // support reading up to eight channels
            //
            unsigned short* readPointers[8];
            
            for (size_t i = 0; i < channels ; ++i)
            {
                readPointers[i] = (unsigned short*)readPtr + (_ifd->optimizationData[i].offset * (pixelsToCopySSE * 8 + pixelsToCopyNormal));
            }
            
            //RGB only
            if(channels==3 || channels == 6 )
            {
                    optimizedWriteToRGB(readPointers[0], readPointers[1], readPointers[2], writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                  
                    //stereo RGB
                    if( channels == 6)
                    {
                        optimizedWriteToRGB(readPointers[3], readPointers[4], readPointers[5], writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }                
            //RGBA
            }else if(channels==4 || channels==8)
            {
                
                if(_ifd->optimizationData[3].fill)
                {
                    optimizedWriteToRGBAFillA(readPointers[0], readPointers[1], readPointers[2], _ifd->optimizationData[3].fillValue.bits() , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }else{
                    optimizedWriteToRGBA(readPointers[0], readPointers[1], readPointers[2], readPointers[3] , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }
                
                //stereo RGBA
                if( channels == 8)
                {
                    if(_ifd->optimizationData[7].fill)
                    {
                        optimizedWriteToRGBAFillA(readPointers[4], readPointers[5], readPointers[6], _ifd->optimizationData[7].fillValue.bits() , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }else{
                        optimizedWriteToRGBA(readPointers[4], readPointers[5], readPointers[6], readPointers[7] , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }
                }
            }
            else {
                throw(IEX_NAMESPACE::LogicExc("IIF mode called with incorrect channel pattern"));
            }
            
            // If we are in NO_OPTIMIZATION mode, this class will never
            // get instantiated, so no need to check for it and duplicate
            // the code.
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}